

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O0

any * Omega_h::anon_unknown_41::access<3>(any *__return_storage_ptr__,LO size,any *var,Args *args)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  type_info *ptVar4;
  ostream *poVar5;
  ParserFail *pPVar6;
  any *operand;
  any *operand_00;
  double dVar7;
  int local_39c;
  allocator local_381;
  string local_380 [39];
  undefined1 local_359;
  string local_358 [32];
  stringstream local_338 [8];
  stringstream ss;
  ostream local_328 [376];
  Read<double> local_1b0;
  Read<double> local_1a0;
  undefined4 local_190;
  Read<double> local_180;
  Read<double> local_170;
  undefined1 local_160 [8];
  Read<double> array;
  Vector<3> local_108;
  int local_f0;
  int local_ec;
  Int j;
  Int i;
  Args *args_local;
  any *var_local;
  any *paStack_d0;
  LO size_local;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined1 *local_a0;
  undefined1 *local_98;
  ulong local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  ulong local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  ulong local_60;
  int local_54;
  Vector<3> *local_50;
  int local_44;
  Vector<3> *local_40;
  int local_38;
  int local_34;
  void **local_30;
  int local_24;
  void **local_20;
  int local_14;
  void **local_10;
  
  _j = args;
  args_local = (Args *)var;
  var_local._4_4_ = size;
  paStack_d0 = __return_storage_ptr__;
  pvVar2 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(args,0);
  dVar7 = any_cast<double>(pvVar2);
  local_ec = (int)dVar7;
  sVar3 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::size(_j);
  if (sVar3 < 2) {
    local_39c = -1;
  }
  else {
    pvVar2 = std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::at(_j,0);
    dVar7 = any_cast<double>(pvVar2);
    local_39c = (int)dVar7;
  }
  local_f0 = local_39c;
  ptVar4 = any::type((any *)args_local);
  bVar1 = std::type_info::operator==(ptVar4,(type_info *)&Vector<3>::typeinfo);
  if (bVar1) {
    any_cast<Omega_h::Vector<3>>(&local_108,(Omega_h *)args_local,operand);
    local_50 = &local_108;
    local_54 = local_ec;
    local_44 = local_ec;
    local_40 = local_50;
    any::any<double&,void>
              (__return_storage_ptr__,(local_50->super_Few<double,_3>).array_ + local_ec);
  }
  else {
    ptVar4 = any::type((any *)args_local);
    bVar1 = std::type_info::operator==(ptVar4,(type_info *)&Matrix<3,3>::typeinfo);
    if (bVar1) {
      any_cast<Omega_h::Matrix<3,3>>
                ((Matrix<3,_3> *)&array.write_.shared_alloc_.direct_ptr,(Omega_h *)args_local,
                 operand_00);
      local_30 = &array.write_.shared_alloc_.direct_ptr;
      local_34 = local_ec;
      local_38 = local_f0;
      local_24 = local_f0;
      local_10 = local_30 + (long)local_f0 * 3;
      local_14 = local_ec;
      local_20 = local_30;
      any::any<double&,void>(__return_storage_ptr__,(double *)(local_10 + local_ec));
    }
    else {
      ptVar4 = any::type((any *)args_local);
      bVar1 = std::type_info::operator==(ptVar4,(type_info *)&Read<double>::typeinfo);
      if (!bVar1) {
        pPVar6 = (ParserFail *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_380,"Unexpected variable type in access operator\n",&local_381);
        ParserFail::ParserFail(pPVar6,(string *)local_380);
        __cxa_throw(pPVar6,&ParserFail::typeinfo,ParserFail::~ParserFail);
      }
      any_cast<Omega_h::Read<double>>((Omega_h *)local_160,(any *)args_local);
      local_b8 = local_160;
      if (((ulong)local_160 & 1) == 0) {
        local_90 = *(size_t *)local_160;
      }
      else {
        local_90 = (ulong)local_160 >> 3;
      }
      local_a0 = local_b8;
      local_98 = local_b8;
      if ((int)(local_90 >> 3) == var_local._4_4_ * 3) {
        Read<double>::Read(&local_180,(Read<double> *)local_160);
        get_component<double>((Omega_h *)&local_170,&local_180,3,local_ec);
        any::any<Omega_h::Read<double>,void>(__return_storage_ptr__,&local_170);
        Read<double>::~Read(&local_170);
        Read<double>::~Read(&local_180);
      }
      else {
        local_c0 = local_160;
        if (((ulong)local_160 & 1) == 0) {
          local_78 = *(size_t *)local_160;
        }
        else {
          local_78 = (ulong)local_160 >> 3;
        }
        local_a4 = 3;
        local_a8 = 3;
        local_88 = local_c0;
        local_80 = local_c0;
        if ((int)(local_78 >> 3) != var_local._4_4_ * 9) {
          std::__cxx11::stringstream::stringstream(local_338);
          poVar5 = std::operator<<(local_328,"Unexpected array size ");
          local_c8 = local_160;
          if (((ulong)local_160 & 1) == 0) {
            local_60 = *(size_t *)local_160;
          }
          else {
            local_60 = (ulong)local_160 >> 3;
          }
          local_70 = local_c8;
          local_68 = local_c8;
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)(local_60 >> 3));
          std::operator<<(poVar5," in access operator\n");
          poVar5 = std::operator<<(local_328,"Value count is ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,var_local._4_4_);
          poVar5 = std::operator<<(poVar5," dimension is ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,3);
          std::operator<<(poVar5,'\n');
          local_359 = 1;
          pPVar6 = (ParserFail *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringstream::str();
          ParserFail::ParserFail(pPVar6,local_358);
          local_359 = 0;
          __cxa_throw(pPVar6,&ParserFail::typeinfo,ParserFail::~ParserFail);
        }
        Read<double>::Read(&local_1b0,(Read<double> *)local_160);
        local_ac = 3;
        local_b0 = 3;
        get_component<double>((Omega_h *)&local_1a0,&local_1b0,9,local_f0 * 3 + local_ec);
        any::any<Omega_h::Read<double>,void>(__return_storage_ptr__,&local_1a0);
        Read<double>::~Read(&local_1a0);
        Read<double>::~Read(&local_1b0);
      }
      local_190 = 1;
      Read<double>::~Read((Read<double> *)local_160);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

any access(LO size, any& var, ExprReader::Args& args) {
  auto i = static_cast<Int>(any_cast<Real>(args.at(0)));
  auto j =
      args.size() > 1 ? static_cast<Int>(any_cast<Real>(args.at(0))) : Int(-1);
  if (var.type() == typeid(Vector<dim>)) {
    return (any_cast<Vector<dim>>(var))(i);
  } else if (var.type() == typeid(Tensor<dim>)) {
    return (any_cast<Tensor<dim>>(var))(i, j);
  } else if (var.type() == typeid(Reals)) {
    auto array = any_cast<Reals>(var);
    if (array.size() == size * dim) {
      return Reals(get_component(array, dim, i));
    } else if (array.size() == size * matrix_ncomps(dim, dim)) {
      return Reals(get_component(array, matrix_ncomps(dim, dim), j * dim + i));
    } else {
      std::stringstream ss;
      ss << "Unexpected array size " << array.size() << " in access operator\n";
      ss << "Value count is " << size << " dimension is " << dim << '\n';
      throw ParserFail(ss.str());
    }
  } else {
    throw ParserFail("Unexpected variable type in access operator\n");
  }
}